

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

xcb_input_get_device_key_mapping_cookie_t
xcb_input_get_device_key_mapping
          (xcb_connection_t *c,uint8_t device_id,xcb_input_key_code_t first_keycode,uint8_t count)

{
  uint uVar1;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined8 *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &local_50;
  local_50 = (ulong)CONCAT16(count,CONCAT15(first_keycode,CONCAT14(device_id,0xaaaaaaaa)));
  uStack_20 = 8;
  local_18 = 0;
  uStack_10 = 0;
  uVar1 = xcb_send_request(c,1,&local_28,&xcb_input_get_device_key_mapping::xcb_req);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (xcb_input_get_device_key_mapping_cookie_t)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

xcb_input_get_device_key_mapping_cookie_t
xcb_input_get_device_key_mapping (xcb_connection_t     *c,
                                  uint8_t               device_id,
                                  xcb_input_key_code_t  first_keycode,
                                  uint8_t               count)
{
    static const xcb_protocol_request_t xcb_req = {
        .count = 2,
        .ext = &xcb_input_id,
        .opcode = XCB_INPUT_GET_DEVICE_KEY_MAPPING,
        .isvoid = 0
    };

    struct iovec xcb_parts[4];
    xcb_input_get_device_key_mapping_cookie_t xcb_ret;
    xcb_input_get_device_key_mapping_request_t xcb_out;

    xcb_out.device_id = device_id;
    xcb_out.first_keycode = first_keycode;
    xcb_out.count = count;
    xcb_out.pad0 = 0;

    xcb_parts[2].iov_base = (char *) &xcb_out;
    xcb_parts[2].iov_len = sizeof(xcb_out);
    xcb_parts[3].iov_base = 0;
    xcb_parts[3].iov_len = -xcb_parts[2].iov_len & 3;

    xcb_ret.sequence = xcb_send_request(c, XCB_REQUEST_CHECKED, xcb_parts + 2, &xcb_req);
    return xcb_ret;
}